

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O2

bool __thiscall FIX::FileStore::get(FileStore *this,SEQNUM msgSeqNum,string *msg)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  const_iterator cVar3;
  void *__ptr;
  _Base_ptr p_Var4;
  IOException *pIVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  SEQNUM msgSeqNum_local;
  
  msgSeqNum_local = msgSeqNum;
  cVar3 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
          ::find(&(this->m_offsets)._M_t,&msgSeqNum_local);
  p_Var1 = &(this->m_offsets)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    iVar2 = fseek((FILE *)this->m_msgFile,(long)cVar3._M_node[1]._M_parent,0);
    if (iVar2 != 0) {
      pIVar5 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&bStack_58,"Unable to seek in file ",&this->m_msgFileName);
      IOException::IOException(pIVar5,&bStack_58);
      __cxa_throw(pIVar5,&IOException::typeinfo,Exception::~Exception);
    }
    p_Var4 = cVar3._M_node[1]._M_left;
    __ptr = operator_new__((ulong)((long)&p_Var4->_M_color + 1));
    p_Var4 = (_Base_ptr)fread(__ptr,1,(size_t)p_Var4,(FILE *)this->m_msgFile);
    iVar2 = ferror((FILE *)this->m_msgFile);
    if ((iVar2 != 0) || (p_Var4 != cVar3._M_node[1]._M_left)) {
      operator_delete__(__ptr);
      pIVar5 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&bStack_58,"Unable to read from file ",&this->m_msgFileName);
      IOException::IOException(pIVar5,&bStack_58);
      __cxa_throw(pIVar5,&IOException::typeinfo,Exception::~Exception);
    }
    *(undefined1 *)((long)__ptr + (long)p_Var4) = 0;
    std::__cxx11::string::assign((char *)msg);
    operator_delete__(__ptr);
  }
  return (_Rb_tree_header *)cVar3._M_node != p_Var1;
}

Assistant:

EXCEPT(IOException) {
  NumToOffset::const_iterator find = m_offsets.find(msgSeqNum);
  if (find == m_offsets.end()) {
    return false;
  }
  const OffsetSize &offset = find->second;
  if (fseek(m_msgFile, offset.first, SEEK_SET)) {
    throw IOException("Unable to seek in file " + m_msgFileName);
  }
  char *buffer = new char[offset.second + 1];
  size_t result = fread(buffer, sizeof(char), offset.second, m_msgFile);
  if (ferror(m_msgFile) || result != (size_t)offset.second) {
    delete[] buffer;
    throw IOException("Unable to read from file " + m_msgFileName);
  }
  buffer[offset.second] = 0;
  msg = buffer;
  delete[] buffer;
  return true;
}